

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O0

bool __thiscall DatetimeParser::parse_hour(DatetimeParser *this,Pig *pig,int *value)

{
  bool bVar1;
  int local_34;
  size_type sStack_30;
  int hour;
  size_type checkpoint;
  int *value_local;
  Pig *pig_local;
  DatetimeParser *this_local;
  
  checkpoint = (size_type)value;
  value_local = (int *)pig;
  pig_local = (Pig *)this;
  sStack_30 = Pig::cursor(pig);
  bVar1 = Pig::getDigit2((Pig *)value_local,&local_34);
  if (((bVar1) && (-1 < local_34)) && (local_34 < 0x18)) {
    *(int *)checkpoint = local_34;
    this_local._7_1_ = true;
  }
  else {
    Pig::restoreTo((Pig *)value_local,sStack_30);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DatetimeParser::parse_hour (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int hour;
  if (pig.getDigit2 (hour) &&
      hour >= 0            &&
      hour < 24)
  {
    value = hour;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}